

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O1

size_t IpmiFruWriteCommonAreas(FILE *ofd)

{
  undefined6 uVar1;
  ipmi_fru_common_header_t iVar2;
  byte bVar3;
  size_t sVar4;
  size_t sVar5;
  char cVar6;
  byte bVar7;
  
  common_header.format_version = '\x01';
  common_header.internal_use_area_offset = '\0';
  common_header.chassis_info_area_offset = '\0';
  common_header.board_info_area_offset = '\0';
  common_header.product_info_area_offset = '\0';
  common_header.multirecord_area_offset = '\0';
  common_header.pad = '\0';
  common_header.checksum = '\0';
  if (chassis_info_area_size == 0) {
    bVar7 = 1;
  }
  else {
    common_header.format_version = '\x01';
    common_header.internal_use_area_offset = '\0';
    common_header.chassis_info_area_offset = '\x01';
    common_header.board_info_area_offset = '\0';
    common_header.product_info_area_offset = '\0';
    common_header.multirecord_area_offset = '\0';
    common_header.pad = '\0';
    common_header.checksum = '\0';
    bVar7 = (char)(chassis_info_area_size >> 3) + 1;
  }
  if (board_info_area_size != 0) {
    common_header.board_info_area_offset = bVar7;
    common_header.product_info_area_offset = '\0';
    common_header.multirecord_area_offset = '\0';
    common_header.pad = '\0';
    common_header.checksum = '\0';
    bVar7 = (char)(board_info_area_size >> 3) + bVar7;
  }
  if (product_info_area_size != 0) {
    common_header.product_info_area_offset = bVar7;
    common_header.multirecord_area_offset = '\0';
    common_header.pad = '\0';
    common_header.checksum = '\0';
    bVar7 = (char)(product_info_area_size >> 3) + bVar7;
  }
  iVar2 = common_header;
  common_header.multirecord_area_offset = bVar7;
  uVar1 = common_header._0_6_;
  common_header.chassis_info_area_offset = iVar2.chassis_info_area_offset;
  bVar3 = ~common_header.chassis_info_area_offset;
  common_header.board_info_area_offset = iVar2.board_info_area_offset;
  common_header.product_info_area_offset = iVar2.product_info_area_offset;
  cVar6 = common_header.board_info_area_offset + bVar7 + common_header.product_info_area_offset;
  common_header.pad = '\0';
  common_header._0_7_ = CONCAT16(common_header.pad,uVar1);
  common_header.checksum = bVar3 - cVar6;
  sVar4 = fwrite(&common_header,1,8,(FILE *)ofd);
  if (sVar4 == 0) {
    IpmiFruWriteCommonAreas_cold_4();
LAB_0010146c:
    sVar5 = 0xffffffffffffffff;
  }
  else {
    if ((ulong)chassis_info_area_size != 0) {
      sVar4 = fwrite(&chassis_info_area,1,(ulong)chassis_info_area_size,(FILE *)ofd);
      if (sVar4 == 0) {
        IpmiFruWriteCommonAreas_cold_1();
        goto LAB_0010146c;
      }
    }
    if ((ulong)board_info_area_size != 0) {
      sVar4 = fwrite(&board_info_area,1,(ulong)board_info_area_size,(FILE *)ofd);
      if (sVar4 == 0) {
        IpmiFruWriteCommonAreas_cold_2();
        goto LAB_0010146c;
      }
    }
    if ((ulong)product_info_area_size != 0) {
      sVar4 = fwrite(&product_info_area,1,(ulong)product_info_area_size,(FILE *)ofd);
      if (sVar4 == 0) {
        IpmiFruWriteCommonAreas_cold_3();
        goto LAB_0010146c;
      }
    }
    sVar5 = (ulong)bVar7 << 3;
  }
  return sVar5;
}

Assistant:

size_t IpmiFruWriteCommonAreas(FILE *ofd)
{
    //  First, populate the common header
    memset(&common_header, 0, sizeof(common_header));
    common_header.format_version = IPMI_FRUINFO_FORMAT_VERSION;
    uint8_t running_offset = 1;
    if (chassis_info_area_size) {
        common_header.chassis_info_area_offset = running_offset;
        running_offset += chassis_info_area_size / 8;
    }
    if (board_info_area_size) {
        common_header.board_info_area_offset = running_offset;
        running_offset += board_info_area_size / 8;
    }
    if (product_info_area_size) {
        common_header.product_info_area_offset = running_offset;
        running_offset += product_info_area_size / 8;
    }
    common_header.multirecord_area_offset = running_offset;
    uint8_t checksum = 
        common_header.format_version +
        common_header.chassis_info_area_offset +
        common_header.board_info_area_offset +
        common_header.product_info_area_offset +
        common_header.multirecord_area_offset;
    common_header.checksum = -checksum;
    //  Write the common header
    if (fwrite(&common_header, 1, sizeof(common_header), ofd) <= 0) {
        fprintf(stderr, "Failed to write common header to the output file\n");
        return -1;
    }
    //  Write chassis info area
    if (chassis_info_area_size) {
        if (fwrite(&chassis_info_area, 1, chassis_info_area_size, ofd) <= 0) {
            fprintf(stderr, "Failed to write chassis info to the output file\n");
            return -1;
        }
    }
    //  Write board info area
    if (board_info_area_size) {
        if (fwrite(&board_info_area, 1, board_info_area_size, ofd) <= 0) {
            fprintf(stderr, "Failed to write board info to the output file\n");
            return -1;
        }
    }
    //  Write product info area
    if (product_info_area_size) {
        if (fwrite(&product_info_area, 1, product_info_area_size, ofd) <= 0) {
            fprintf(stderr, "Failed to write product info to the output file\n");
            return -1;
        }
    }
    return (size_t)running_offset * 8;
}